

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O2

spv_result_t __thiscall
spvtools::val::Function::RegisterSelectionMerge(Function *this,uint32_t merge_id)

{
  mapped_type pBVar1;
  mapped_type *this_00;
  mapped_type *ppBVar2;
  uint32_t merge_id_local;
  Construct local_78;
  _Vector_base<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_> local_48;
  
  merge_id_local = merge_id;
  RegisterBlock(this,merge_id,false);
  this_00 = std::__detail::
            _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::val::BasicBlock>,_std::allocator<std::pair<const_unsigned_int,_spvtools::val::BasicBlock>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::val::BasicBlock>,_std::allocator<std::pair<const_unsigned_int,_spvtools::val::BasicBlock>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  *)&this->blocks_,&merge_id_local);
  BasicBlock::set_type(this->current_block_,kBlockTypeSelection);
  BasicBlock::set_type(this_00,kBlockTypeMerge);
  pBVar1 = this->current_block_;
  local_78._0_8_ = this_00;
  ppBVar2 = std::__detail::
            _Map_base<spvtools::val::BasicBlock_*,_std::pair<spvtools::val::BasicBlock_*const,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*const,_spvtools::val::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::val::BasicBlock_*>,_std::hash<spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<spvtools::val::BasicBlock_*,_std::pair<spvtools::val::BasicBlock_*const,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*const,_spvtools::val::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::val::BasicBlock_*>,_std::hash<spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&this->merge_block_header_,(key_type *)&local_78);
  *ppBVar2 = pBVar1;
  BasicBlock::RegisterStructuralSuccessor(this->current_block_,this_00);
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Construct::Construct
            (&local_78,kSelection,this->current_block_,this_00,
             (vector<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_> *)
             &local_48);
  AddConstruct(this,&local_78);
  std::_Vector_base<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>::
  ~_Vector_base(&local_78.corresponding_constructs_.
                 super__Vector_base<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>
               );
  std::_Vector_base<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>::
  ~_Vector_base(&local_48);
  return SPV_SUCCESS;
}

Assistant:

spv_result_t Function::RegisterSelectionMerge(uint32_t merge_id) {
  RegisterBlock(merge_id, false);
  BasicBlock& merge_block = blocks_.at(merge_id);
  current_block_->set_type(kBlockTypeSelection);
  merge_block.set_type(kBlockTypeMerge);
  merge_block_header_[&merge_block] = current_block_;
  current_block_->RegisterStructuralSuccessor(&merge_block);

  AddConstruct({ConstructType::kSelection, current_block(), &merge_block});

  return SPV_SUCCESS;
}